

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimeNode(SC_Man *p,Abc_Obj_t *pObj,int fDept)

{
  float fVar1;
  Vec_Flt_t *p_00;
  int iVar2;
  SC_Pair *pSVar3;
  SC_Pair *pSVar4;
  SC_Cell *pCell_00;
  Abc_Obj_t *pFanin_00;
  SC_Timing *pTime_00;
  float fVar5;
  float fVar6;
  double dVar7;
  float local_88;
  float EstDelta_1;
  SC_Pair *pArrOut;
  SC_Pair *pDepOut_1;
  float EstDelta;
  SC_Pair *pDepOut;
  Abc_Obj_t *pFanin;
  float local_50;
  float Value;
  float DeptFall;
  float DeptRise;
  float LoadFall;
  float LoadRise;
  SC_Pair *pLoad;
  int k;
  SC_Cell *pCell;
  SC_Timing *pTime;
  int fDept_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  pSVar3 = Abc_SclObjLoad(p,pObj);
  fVar5 = pSVar3->rise;
  fVar1 = pSVar3->fall;
  Value = 0.0;
  local_50 = 0.0;
  if ((p->EstLoadMax != 0.0) || (NAN(p->EstLoadMax))) {
    local_88 = Abc_SclObjLoadValue(p,pObj);
  }
  else {
    local_88 = 0.0;
  }
  iVar2 = Abc_ObjIsCi(pObj);
  if (iVar2 == 0) {
    iVar2 = Abc_ObjIsCo(pObj);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjIsNode(pObj);
      if (iVar2 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.c"
                      ,0x150,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
      }
      if (((p->EstLoadMax != 0.0) || (NAN(p->EstLoadMax))) && (1.0 < local_88)) {
        pSVar3->rise = p->EstLoadAve * p->EstLoadMax;
        pSVar3->fall = p->EstLoadAve * p->EstLoadMax;
        if (fDept != 0) {
          pSVar4 = Abc_SclObjDept(p,pObj);
          fVar6 = p->EstLinear;
          dVar7 = log((double)local_88);
          fVar6 = (float)((double)fVar6 * dVar7);
          Value = pSVar4->rise;
          local_50 = pSVar4->fall;
          pSVar4->rise = fVar6 + pSVar4->rise;
          pSVar4->fall = fVar6 + pSVar4->fall;
        }
        p->nEstNodes = p->nEstNodes + 1;
      }
      pCell_00 = Abc_SclObjCell(pObj);
      for (pLoad._4_4_ = 0; iVar2 = Abc_ObjFaninNum(pObj), pLoad._4_4_ < iVar2;
          pLoad._4_4_ = pLoad._4_4_ + 1) {
        pFanin_00 = Abc_ObjFanin(pObj,pLoad._4_4_);
        pTime_00 = Scl_CellPinTime(pCell_00,pLoad._4_4_);
        if (fDept == 0) {
          Abc_SclTimeFanin(p,pTime_00,pObj,pFanin_00);
        }
        else {
          Abc_SclDeptFanin(p,pTime_00,pObj,pFanin_00);
        }
      }
      if (((p->EstLoadMax != 0.0) || (NAN(p->EstLoadMax))) && (1.0 < local_88)) {
        pSVar3->rise = fVar5;
        pSVar3->fall = fVar1;
        if (fDept == 0) {
          pSVar3 = Abc_SclObjTime(p,pObj);
          fVar5 = p->EstLinear;
          dVar7 = log((double)local_88);
          fVar5 = (float)((double)fVar5 * dVar7);
          pSVar3->rise = fVar5 + pSVar3->rise;
          pSVar3->fall = fVar5 + pSVar3->fall;
        }
        else {
          pSVar3 = Abc_SclObjDept(p,pObj);
          pSVar3->rise = Value;
          pSVar3->fall = local_50;
        }
      }
    }
    else if (fDept == 0) {
      Abc_SclObjDupFanin(p,pObj);
      p_00 = p->vTimesOut;
      iVar2 = (pObj->field_5).iData;
      fVar5 = Abc_SclObjTimeMax(p,pObj);
      Vec_FltWriteEntry(p_00,iVar2,fVar5);
      Vec_QueUpdate(p->vQue,(pObj->field_5).iData);
    }
  }
  else {
    if (fDept != 0) {
      __assert_fail("!fDept",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.c"
                    ,0x142,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
    }
    Abc_SclTimeCi(p,pObj);
  }
  return;
}

Assistant:

void Abc_SclTimeNode( SC_Man * p, Abc_Obj_t * pObj, int fDept )
{
    SC_Timing * pTime;
    SC_Cell * pCell;
    int k;
    SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
    float LoadRise = pLoad->rise;
    float LoadFall = pLoad->fall;
    float DeptRise = 0;
    float DeptFall = 0;
    float Value = p->EstLoadMax ? Abc_SclObjLoadValue( p, pObj ) : 0;
    Abc_Obj_t * pFanin;
    if ( Abc_ObjIsCi(pObj) )
    {
        assert( !fDept );
        Abc_SclTimeCi( p, pObj );
        return;
    }
    if ( Abc_ObjIsCo(pObj) )
    {
        if ( !fDept )
        {
            Abc_SclObjDupFanin( p, pObj );
            Vec_FltWriteEntry( p->vTimesOut, pObj->iData, Abc_SclObjTimeMax(p, pObj) );
            Vec_QueUpdate( p->vQue, pObj->iData );
        }
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
//    if ( !(Abc_ObjFaninNum(pObj) == 1 && Abc_ObjIsPi(Abc_ObjFanin0(pObj))) && p->EstLoadMax && Value > 1 )
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = p->EstLoadAve * p->EstLoadMax;
        pLoad->fall = p->EstLoadAve * p->EstLoadMax;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            DeptRise = pDepOut->rise;
            DeptFall = pDepOut->fall;
            pDepOut->rise += EstDelta;
            pDepOut->fall += EstDelta;
        }
        p->nEstNodes++;
    }
    // get the library cell
    pCell = Abc_SclObjCell( pObj );
    // compute for each fanin
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        pTime = Scl_CellPinTime( pCell, k );
        if ( fDept )
            Abc_SclDeptFanin( p, pTime, pObj, pFanin );
        else
            Abc_SclTimeFanin( p, pTime, pObj, pFanin );
    }
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = LoadRise;
        pLoad->fall = LoadFall;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            pDepOut->rise = DeptRise;
            pDepOut->fall = DeptFall;
        }
        else
        {
            SC_Pair * pArrOut  = Abc_SclObjTime( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            pArrOut->rise += EstDelta;
            pArrOut->fall += EstDelta;
        }
    }
}